

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O3

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::setEqual
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *to,Bucket *from)

{
  pointer ppVar1;
  iterator __begin4;
  pointer ppVar2;
  pointer ppVar3;
  
  ppVar2 = (this->borderBuckets).
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->borderBuckets).
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar1) {
    ppVar3 = ppVar2;
    do {
      if (((ppVar3->second)._M_data)->id == from->id) {
        if (ppVar3->first != 0xffffffffffffffff) {
          do {
            if (from->id == ((ppVar2->second)._M_data)->id) {
              (ppVar2->second)._M_data = to;
            }
            ppVar2 = ppVar2 + 1;
          } while (ppVar2 != ppVar1);
        }
        break;
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  ValueRelations::areMerged(this->reported,to,from);
  Bucket::merge(to,from);
  erase(this,from);
  return true;
}

Assistant:

bool setEqual(Bucket &to, Bucket &from) {
        assert(to != from);
        if (getBorderId(from) != std::string::npos) {
            assert(getBorderId(to) ==
                   std::string::npos); // cannot merge two border buckets
            for (auto &pair : borderBuckets) {
                if (from == pair.second)
                    pair.second = to;
            }
        }
        reported.areMerged(to, from);
        to.merge(from);
        erase(from);
        return true;
    }